

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatetimeedit.cpp
# Opt level: O2

void QDateEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  qint64 *pqVar1;
  QDate QVar2;
  
  if (_id == 0 && _c == InvokeMetaMethod) {
    userDateChanged((QDateEdit *)_o,(QDate)*_a[1]);
  }
  if (_c == ReadProperty) {
    if (_id == 0) {
      pqVar1 = (qint64 *)*_a;
      QVar2 = QDateTimeEdit::date((QDateTimeEdit *)_o);
      *pqVar1 = QVar2.jd;
    }
  }
  else if (_c == WriteProperty) {
    if (_id == 0) {
      QDateTimeEdit::setDate((QDateTimeEdit *)_o,(QDate)**_a);
      return;
    }
  }
  else if (_c == IndexOfMethod) {
    QtMocHelpers::indexOfMethod<void(QDateEdit::*)(QDate)>
              ((QtMocHelpers *)_a,(void **)userDateChanged,0,0);
    return;
  }
  return;
}

Assistant:

void QDateEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDateEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->userDateChanged((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDateEdit::*)(QDate )>(_a, &QDateEdit::userDateChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QDate*>(_v) = _t->date(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDate(*reinterpret_cast<QDate*>(_v)); break;
        default: break;
        }
    }
}